

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_k_means_test.cc
# Opt level: O0

void __thiscall
AV1Kmeans::AV1KmeansTest1::RunSpeedTest
          (AV1KmeansTest1 *this,av1_calc_indices_dim1_func test_impl,BLOCK_SIZE_conflict bsize,int k
          )

{
  code *pcVar1;
  int64_t iVar2;
  uint in_ECX;
  byte in_DL;
  long in_RDI;
  double time;
  int j;
  av1_calc_indices_dim1_func func;
  aom_usec_timer timer;
  int i;
  double elapsed_time [2];
  av1_calc_indices_dim1_func funcs [2];
  int num_loops;
  int n;
  int h;
  int w;
  int local_7c;
  aom_usec_timer local_70;
  int local_4c;
  double local_48 [2];
  code *local_38 [2];
  int local_28;
  uint local_24;
  uint local_20;
  uint local_1c;
  uint local_18;
  
  local_1c = (uint)::block_size_wide[in_DL];
  local_20 = (uint)::block_size_high[in_DL];
  local_24 = local_1c * local_20;
  local_28 = (int)(1000000000 / (ulong)(long)(int)local_24);
  local_38[0] = av1_calc_indices_dim1_c;
  local_18 = in_ECX;
  memset(local_48,0,0x10);
  for (local_4c = 0; local_4c < 2; local_4c = local_4c + 1) {
    ::aom_usec_timer_start((aom_usec_timer *)0x9ec3f8);
    pcVar1 = local_38[local_4c];
    for (local_7c = 0; local_7c < local_28; local_7c = local_7c + 1) {
      (*pcVar1)(in_RDI + 0x1c,in_RDI + 0x201c,in_RDI + 0x202c,0,local_24,local_18);
    }
    ::aom_usec_timer_mark((aom_usec_timer *)0x9ec463);
    iVar2 = ::aom_usec_timer_elapsed(&local_70);
    local_48[local_4c] = ((double)iVar2 * 1000.0) / (double)local_28;
  }
  printf("av1_calc_indices_dim1 indices= %d centroids=%d: %7.2f/%7.2fns",local_48[0],local_48[1],
         (ulong)local_24,(ulong)local_18);
  printf("(%3.2f)\n",local_48[0] / local_48[1]);
  return;
}

Assistant:

void AV1KmeansTest1::RunSpeedTest(av1_calc_indices_dim1_func test_impl,
                                  BLOCK_SIZE bsize, int k) {
  const int w = block_size_wide[bsize];
  const int h = block_size_high[bsize];
  const int n = w * h;
  const int num_loops = 1000000000 / n;

  av1_calc_indices_dim1_func funcs[2] = { av1_calc_indices_dim1_c, test_impl };
  double elapsed_time[2] = { 0 };
  for (int i = 0; i < 2; ++i) {
    aom_usec_timer timer;
    aom_usec_timer_start(&timer);
    av1_calc_indices_dim1_func func = funcs[i];
    for (int j = 0; j < num_loops; ++j) {
      func(data_, centroids_, indices1_, /*total_dist=*/nullptr, n, k);
    }
    aom_usec_timer_mark(&timer);
    double time = static_cast<double>(aom_usec_timer_elapsed(&timer));
    elapsed_time[i] = 1000.0 * time / num_loops;
  }
  printf("av1_calc_indices_dim1 indices= %d centroids=%d: %7.2f/%7.2fns", n, k,
         elapsed_time[0], elapsed_time[1]);
  printf("(%3.2f)\n", elapsed_time[0] / elapsed_time[1]);
}